

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O3

Curl_ssl_scache * cf_ssl_scache_get(Curl_easy *data)

{
  Curl_ssl_scache *pCVar1;
  
  if (((data->share == (Curl_share *)0x0) ||
      (pCVar1 = data->share->ssl_scache, pCVar1 == (Curl_ssl_scache *)0x0)) &&
     ((data->multi == (Curl_multi *)0x0 ||
      (pCVar1 = data->multi->ssl_scache, pCVar1 == (Curl_ssl_scache *)0x0)))) {
    return (Curl_ssl_scache *)0x0;
  }
  if (pCVar1->magic != 0xe1551) {
    Curl_failf(data,"transfer would use an invalid scache at %p, denied",pCVar1);
    pCVar1 = (Curl_ssl_scache *)0x0;
  }
  return pCVar1;
}

Assistant:

static struct Curl_ssl_scache *cf_ssl_scache_get(struct Curl_easy *data)
{
  struct Curl_ssl_scache *scache = NULL;
  /* If a share is present, its ssl_scache has preference over the multi */
  if(data->share && data->share->ssl_scache)
    scache = data->share->ssl_scache;
  else if(data->multi && data->multi->ssl_scache)
    scache = data->multi->ssl_scache;
  if(scache && !GOOD_SCACHE(scache)) {
    failf(data, "transfer would use an invalid scache at %p, denied",
          (void *)scache);
    DEBUGASSERT(0);
    return NULL;
  }
  return scache;
}